

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::RuntimeCharTrie::FreeBody(RuntimeCharTrie *this,ArenaAllocator *allocator)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = this->count;
  if (0 < (int)uVar1) {
    lVar3 = 8;
    lVar2 = 0;
    do {
      FreeBody((RuntimeCharTrie *)((long)&this->children->c + lVar3),allocator);
      lVar2 = lVar2 + 1;
      uVar1 = this->count;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < (int)uVar1);
  }
  if (0 < (int)uVar1) {
    Memory::DeleteArray<Memory::ArenaAllocator,UnifiedRegex::RuntimeCharTrieEntry>
              (allocator,(ulong)uVar1,this->children);
  }
  this->count = 0;
  this->children = (RuntimeCharTrieEntry *)0x0;
  return;
}

Assistant:

void RuntimeCharTrie::FreeBody(ArenaAllocator* allocator)
    {
        for (int i = 0; i < count; i++)
            children[i].node.FreeBody(allocator);
        if (count > 0)
            AdeleteArray(allocator, count, children);
#if DBG
        count = 0;
        children = 0;
#endif
    }